

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfTiledOutputFile.cpp
# Opt level: O3

void __thiscall Imf_3_2::anon_unknown_6::TileBufferTask::execute(TileBufferTask *this)

{
  TileBuffer *pTVar1;
  size_t xStride;
  uint *puVar2;
  long *plVar3;
  long lVar4;
  int iVar5;
  long lVar6;
  Data *pDVar7;
  pointer pTVar8;
  long lVar9;
  pointer pTVar10;
  int iVar11;
  ulong uVar12;
  int iVar13;
  ulong uVar14;
  int iVar15;
  int iVar16;
  char *pcVar17;
  bool bVar18;
  Box2i tileRange;
  char *readPtr;
  int local_5c;
  char *writePtr;
  char *compPtr;
  char *readPtr_1;
  undefined1 local_40 [8];
  int local_38;
  
  pTVar1 = this->_tileBuffer;
  pcVar17 = (char *)(pTVar1->sampleCount)._sizeY;
  pDVar7 = this->_ofd;
  writePtr = pcVar17;
  Imf_3_2::dataWindowForTile
            ((Imf_3_2 *)&tileRange,&pDVar7->tileDesc,pDVar7->minX,pDVar7->maxX,pDVar7->minY,
             pDVar7->maxY,(int)pTVar1->dataSize,*(int *)((long)&pTVar1->dataSize + 4),
             (int)pTVar1->uncompressedDataSize,*(int *)((long)&pTVar1->uncompressedDataSize + 4));
  lVar9 = (long)tileRange.max.x;
  lVar6 = (long)tileRange.min.x;
  iVar15 = (int)(lVar9 - lVar6) + 1;
  iVar5 = tileRange.max.y - tileRange.min.y;
  iVar16 = iVar15;
  if (tileRange.min.y <= tileRange.max.y) {
    pDVar7 = this->_ofd;
    iVar13 = tileRange.min.y;
    iVar11 = tileRange.max.y;
    local_5c = iVar15;
    do {
      pTVar8 = (pDVar7->slices).
               super__Vector_base<Imf_3_2::(anonymous_namespace)::TOutSliceInfo,_std::allocator<Imf_3_2::(anonymous_namespace)::TOutSliceInfo>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if ((pDVar7->slices).
          super__Vector_base<Imf_3_2::(anonymous_namespace)::TOutSliceInfo,_std::allocator<Imf_3_2::(anonymous_namespace)::TOutSliceInfo>_>
          ._M_impl.super__Vector_impl_data._M_finish != pTVar8) {
        uVar14 = 0;
        uVar12 = 1;
        do {
          pTVar10 = pTVar8 + uVar14;
          if (pTVar8[uVar14].zero == true) {
            fillChannelWithZeroes(&writePtr,pDVar7->format,pTVar10->type,(long)iVar15);
          }
          else {
            xStride = pTVar10->xStride;
            readPtr = pTVar10->base +
                      (long)(iVar13 - tileRange.min.y * pTVar10->yTileCoords) * pTVar10->yStride +
                      (long)((1 - pTVar10->xTileCoords) * tileRange.min.x) * xStride;
            copyFromFrameBuffer(&writePtr,&readPtr,readPtr + xStride * (lVar9 - lVar6),xStride,
                                pDVar7->format,pTVar10->type);
          }
          pDVar7 = this->_ofd;
          pTVar8 = (pDVar7->slices).
                   super__Vector_base<Imf_3_2::(anonymous_namespace)::TOutSliceInfo,_std::allocator<Imf_3_2::(anonymous_namespace)::TOutSliceInfo>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          uVar14 = ((long)(pDVar7->slices).
                          super__Vector_base<Imf_3_2::(anonymous_namespace)::TOutSliceInfo,_std::allocator<Imf_3_2::(anonymous_namespace)::TOutSliceInfo>_>
                          ._M_impl.super__Vector_impl_data._M_finish - (long)pTVar8 >> 4) *
                   -0x5555555555555555;
          bVar18 = uVar12 <= uVar14;
          lVar4 = uVar14 - uVar12;
          uVar14 = uVar12;
          uVar12 = (ulong)((int)uVar12 + 1);
          iVar11 = tileRange.max.y;
        } while (bVar18 && lVar4 != 0);
      }
      bVar18 = iVar13 < iVar11;
      pcVar17 = writePtr;
      iVar13 = iVar13 + 1;
      iVar16 = local_5c;
    } while (bVar18);
  }
  pTVar1 = this->_tileBuffer;
  puVar2 = (uint *)(pTVar1->sampleCount)._sizeY;
  plVar3 = (long *)pTVar1->buffer;
  iVar15 = (int)pcVar17 - (int)puVar2;
  *(int *)&pTVar1->uncompressedData = iVar15;
  (pTVar1->sampleCount)._data = puVar2;
  if (plVar3 != (long *)0x0) {
    local_38 = tileRange.max.x;
    iVar15 = (**(code **)(*plVar3 + 0x28))(plVar3,puVar2,iVar15,local_40,&compPtr);
    pTVar1 = this->_tileBuffer;
    if (iVar15 < *(int *)&pTVar1->uncompressedData) {
      *(int *)&pTVar1->uncompressedData = iVar15;
      (pTVar1->sampleCount)._data = (uint *)compPtr;
    }
    else {
      pDVar7 = this->_ofd;
      if ((pDVar7->format == NATIVE) && (readPtr = (char *)(pTVar1->sampleCount)._sizeY, -1 < iVar5)
         ) {
        pTVar8 = (pDVar7->slices).
                 super__Vector_base<Imf_3_2::(anonymous_namespace)::TOutSliceInfo,_std::allocator<Imf_3_2::(anonymous_namespace)::TOutSliceInfo>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        pTVar10 = (pDVar7->slices).
                  super__Vector_base<Imf_3_2::(anonymous_namespace)::TOutSliceInfo,_std::allocator<Imf_3_2::(anonymous_namespace)::TOutSliceInfo>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        readPtr_1 = readPtr;
        iVar15 = 0;
        do {
          if (pTVar10 != pTVar8) {
            uVar14 = 0;
            uVar12 = 1;
            do {
              convertInPlace(&readPtr,&readPtr_1,pTVar8[uVar14].type,(long)iVar16);
              pTVar8 = (pDVar7->slices).
                       super__Vector_base<Imf_3_2::(anonymous_namespace)::TOutSliceInfo,_std::allocator<Imf_3_2::(anonymous_namespace)::TOutSliceInfo>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              pTVar10 = (pDVar7->slices).
                        super__Vector_base<Imf_3_2::(anonymous_namespace)::TOutSliceInfo,_std::allocator<Imf_3_2::(anonymous_namespace)::TOutSliceInfo>_>
                        ._M_impl.super__Vector_impl_data._M_finish;
              uVar14 = ((long)pTVar10 - (long)pTVar8 >> 4) * -0x5555555555555555;
              bVar18 = uVar12 <= uVar14;
              lVar6 = uVar14 - uVar12;
              uVar14 = uVar12;
              uVar12 = (ulong)((int)uVar12 + 1);
            } while (bVar18 && lVar6 != 0);
          }
          bVar18 = iVar15 != iVar5;
          iVar15 = iVar15 + 1;
        } while (bVar18);
      }
    }
  }
  return;
}

Assistant:

void
TileBufferTask::execute ()
{
    try
    {
        //
        // First copy the pixel data from the frame buffer
        // into the tile buffer
        //
        // Convert one tile's worth of pixel data to
        // a machine-independent representation, and store
        // the result in _tileBuffer->buffer.
        //

        char* writePtr = _tileBuffer->buffer;

        Box2i tileRange = dataWindowForTile (
            _ofd->tileDesc,
            _ofd->minX,
            _ofd->maxX,
            _ofd->minY,
            _ofd->maxY,
            _tileBuffer->tileCoord.dx,
            _tileBuffer->tileCoord.dy,
            _tileBuffer->tileCoord.lx,
            _tileBuffer->tileCoord.ly);

        int numScanLines         = tileRange.max.y - tileRange.min.y + 1;
        int numPixelsPerScanLine = tileRange.max.x - tileRange.min.x + 1;

        //
        // Iterate over the scan lines in the tile.
        //

        for (int y = tileRange.min.y; y <= tileRange.max.y; ++y)
        {
            //
            // Iterate over all image channels.
            //

            for (unsigned int i = 0; i < _ofd->slices.size (); ++i)
            {
                const TOutSliceInfo& slice = _ofd->slices[i];

                //
                // These offsets are used to facilitate both absolute
                // and tile-relative pixel coordinates.
                //

                int xOffset = slice.xTileCoords * tileRange.min.x;
                int yOffset = slice.yTileCoords * tileRange.min.y;

                //
                // Fill the tile buffer with pixel data.
                //

                if (slice.zero)
                {
                    //
                    // The frame buffer contains no data for this channel.
                    // Store zeroes in _data->tileBuffer.
                    //

                    fillChannelWithZeroes (
                        writePtr,
                        _ofd->format,
                        slice.type,
                        numPixelsPerScanLine);
                }
                else
                {
                    //
                    // The frame buffer contains data for this channel.
                    //

                    intptr_t    base = reinterpret_cast<intptr_t> (slice.base);
                    const char* readPtr = reinterpret_cast<const char*> (
                        base + (y - yOffset) * slice.yStride +
                        (tileRange.min.x - xOffset) * slice.xStride);

                    const char* endPtr =
                        readPtr + (numPixelsPerScanLine - 1) * slice.xStride;

                    copyFromFrameBuffer (
                        writePtr,
                        readPtr,
                        endPtr,
                        slice.xStride,
                        _ofd->format,
                        slice.type);
                }
            }
        }

        //
        // Compress the contents of the tileBuffer,
        // and store the compressed data in the output file.
        //

        _tileBuffer->dataSize = writePtr - _tileBuffer->buffer;
        _tileBuffer->dataPtr  = _tileBuffer->buffer;

        if (_tileBuffer->compressor)
        {
            const char* compPtr;

            int compSize = _tileBuffer->compressor->compressTile (
                _tileBuffer->dataPtr,
                _tileBuffer->dataSize,
                tileRange,
                compPtr);

            if (compSize < _tileBuffer->dataSize)
            {
                _tileBuffer->dataSize = compSize;
                _tileBuffer->dataPtr  = compPtr;
            }
            else if (_ofd->format == Compressor::NATIVE)
            {
                //
                // The data did not shrink during compression, but
                // we cannot write to the file using native format,
                // so we need to convert the lineBuffer to Xdr.
                //

                convertToXdr (
                    _ofd,
                    _tileBuffer->buffer,
                    numScanLines,
                    numPixelsPerScanLine);
            }
        }
    }
    catch (std::exception& e)
    {
        if (!_tileBuffer->hasException)
        {
            _tileBuffer->exception    = e.what ();
            _tileBuffer->hasException = true;
        }
    }
    catch (...)
    {
        if (!_tileBuffer->hasException)
        {
            _tileBuffer->exception    = "unrecognized exception";
            _tileBuffer->hasException = true;
        }
    }
}